

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dungeon.c
# Opt level: O0

void next_level(boolean at_stairs)

{
  d_level local_b;
  boolean local_9;
  d_level newlevel;
  boolean at_stairs_local;
  
  local_9 = at_stairs;
  if (((at_stairs == '\0') || (u.ux != (level->sstairs).sx)) || (u.uy != (level->sstairs).sy)) {
    local_b.dnum = u.uz.dnum;
    local_b.dlevel = u.uz.dlevel + '\x01';
    goto_level(&local_b,at_stairs,(at_stairs != '\0' ^ 0xffU) & 1,'\0');
  }
  else {
    goto_level(&(level->sstairs).tolev,at_stairs,'\0','\0');
  }
  return;
}

Assistant:

void next_level(boolean at_stairs)
{
	if (at_stairs && u.ux == level->sstairs.sx && u.uy == level->sstairs.sy) {
		/* Taking a down dungeon branch. */
		goto_level(&level->sstairs.tolev, at_stairs, FALSE, FALSE);
	} else {
		/* Going down a stairs or jump in a trap door. */
		d_level	newlevel;

		newlevel.dnum = u.uz.dnum;
		newlevel.dlevel = u.uz.dlevel + 1;
		goto_level(&newlevel, at_stairs, !at_stairs, FALSE);
	}
}